

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptProxy::HasOwnItem(JavascriptProxy *this,uint32 index)

{
  ImplicitCallFlags IVar1;
  PropertyId propertyId;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  JavascriptFunction *function;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  int iVar5;
  HostScriptContext *pHVar6;
  RecyclableObject *pRVar7;
  PropertyRecord *local_80;
  PropertyRecord *propertyRecord;
  Type local_70;
  Type local_68;
  Type local_60;
  Var local_58;
  JavascriptFunction *local_48;
  RecyclableObject *local_40;
  bool local_31;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pHVar6 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar6->scriptContext;
  pRVar7 = MarshalHandler(this,pSVar2);
  if (pRVar7 == (RecyclableObject *)0x0) {
    bVar3 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar3) {
      return 0;
    }
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"has");
  }
  local_40 = MarshalTarget(this,pSVar2);
  local_48 = GetMethodHelper(this,0xb4,pSVar2);
  if ((local_48 == (JavascriptFunction *)0x0) ||
     (bVar3 = ScriptContext::IsHeapEnumInProgress(pSVar2), bVar3)) {
    BVar4 = JavascriptOperators::HasOwnItem(local_40,index);
    return BVar4;
  }
  PropertyIdFromInt(this,index,&local_80);
  propertyId = local_80->pid;
  local_58 = GetName(pSVar2,propertyId);
  function = local_48;
  local_70.ptr = local_48;
  local_60.ptr = local_40;
  local_31 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  propertyRecord = (PropertyRecord *)this_00;
  local_68.ptr = pRVar7;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)local_48);
  bVar3 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar3) {
    pRVar7 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()
                       ((anon_class_40_5_39f35981 *)&propertyRecord);
    bVar3 = ThreadContext::IsOnStack(pRVar7);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar7 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba66ee;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar7 = (RecyclableObject *)
               anon_func::anon_class_40_5_39f35981::operator()
                         ((anon_class_40_5_39f35981 *)&propertyRecord);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ba66ee;
    }
    pRVar7 = (RecyclableObject *)
             anon_func::anon_class_40_5_39f35981::operator()
                       ((anon_class_40_5_39f35981 *)&propertyRecord);
    bVar3 = ThreadContext::IsOnStack(pRVar7);
  }
  if (bVar3 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba66ee:
  this_00->reentrancySafeOrHandled = local_31;
  BVar4 = JavascriptConversion::ToBoolean(pRVar7,pSVar2);
  if (BVar4 == 0) {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
    BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                      (local_40,propertyId,pSVar2,(PropertyDescriptor *)&propertyRecord);
    if ((BVar4 != 0) &&
       ((bVar3 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)&propertyRecord), !bVar3
        || (iVar5 = (*(local_40->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x33])(), iVar5 == 0)))) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"has");
    }
    BVar4 = 0;
  }
  return BVar4;
}

Assistant:

BOOL JavascriptProxy::HasOwnItem(uint32 index)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::HasOwnItem(object, index);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        return HasPropertyTrap(fn, getPropertyId);
    }